

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_mset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *ch_00;
  CClass *pCVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  tribe_type *ptVar10;
  CProficiencies *pCVar11;
  char arg2 [4608];
  char arg3 [4608];
  char buf [300];
  char arg1 [4608];
  
  smash_tilde(argument);
  pcVar5 = one_argument(argument,arg1);
  pcVar5 = one_argument(pcVar5,arg2);
  strcpy(arg3,pcVar5);
  if (((arg1[0] == '\0') || (arg2[0] == '\0')) || (arg3[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set char <name> <field> <value>\n\r",ch);
    send_to_char("  Field being one of:\n\r",ch);
    send_to_char("    str int wis dex con sex class level\n\r",ch);
    send_to_char("    race group gold hp mana move prac\n\r",ch);
    send_to_char("    align train thirst hunger drunk home\n\r",ch);
    send_to_char("    xptotal size dam_mod tribe special pause\n\r",ch);
    pcVar5 = "    beauty security aggressor proficiency profpoints\n\r";
    goto LAB_002ccbd8;
  }
  ch_00 = get_char_world(ch,arg1);
  if (ch_00 == (CHAR_DATA *)0x0) {
    pcVar5 = "They aren\'t here.\n\r";
    goto LAB_002ccbd8;
  }
  ch_00->zone = (AREA_DATA_conflict *)0x0;
  bVar1 = is_number(arg3);
  if (bVar1) {
    uVar3 = atoi(arg3);
  }
  else {
    uVar3 = 0xffffffff;
  }
  bVar1 = str_cmp(arg2,"aggressor");
  if (!bVar1) {
    init_affect((AFFECT_DATA *)buf);
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = (undefined1)gsn_aggressor;
    buf[0x1d] = gsn_aggressor._1_1_;
    buf[0x38] = '\x05';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x1e] = '<';
    buf[0x1f] = '\0';
    buf[0x20] = '\f';
    buf[0x21] = '\0';
    affect_to_char(ch_00,(AFFECT_DATA *)buf);
    pcVar5 = "Aggressor status set.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"beauty");
  sVar2 = (short)uVar3;
  if (!bVar1) {
    if (uVar3 - 1 < 10) {
      ch_00->pcdata->beauty = sVar2;
      return;
    }
    pcVar5 = "Invalid beauty modifier.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"size");
  if (!bVar1) {
    if (uVar3 < 7) {
      ch_00->size = sVar2;
      return;
    }
    pcVar5 = "Invalid size value.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"xptotal");
  if (!bVar1) {
    if (-1 < (int)uVar3) {
      ch_00->exp = uVar3;
      return;
    }
    pcVar5 = "Xp total must be greater than 0.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"home");
  if (!bVar1) {
    iVar4 = hometown_lookup(arg3);
    if (iVar4 != 0) {
      iVar4 = hometown_lookup(arg3);
      ch_00->hometown = iVar4;
      return;
    }
    pcVar5 = "No such hometown.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"sp");
  if (!bVar1) {
    if (uVar3 < 0x4e21) {
      ch_00->pcdata->sp = sVar2;
      return;
    }
    pcVar5 = "Specialization points are between 0 and 20000.\n\r";
    goto LAB_002ccbd8;
  }
  bVar1 = str_cmp(arg2,"str");
  if (bVar1) {
    bVar1 = str_cmp(arg2,"security");
    if (!bVar1) {
      bVar1 = is_npc(ch_00);
      if (!bVar1) {
        if (uVar3 < 0xb) {
          ch_00->pcdata->security = uVar3;
          return;
        }
        pcVar5 = "Valid security is 0-10 only.\n\r";
        goto LAB_002ccbd8;
      }
      goto LAB_002cccf9;
    }
    bVar1 = str_cmp(arg2,"int");
    if (bVar1) {
      bVar1 = str_cmp(arg2,"wis");
      if (bVar1) {
        bVar1 = str_cmp(arg2,"dex");
        if (bVar1) {
          bVar1 = str_cmp(arg2,"con");
          if (bVar1) {
            bVar1 = str_prefix(arg2,"sex");
            if (!bVar1) {
              if (uVar3 < 3) {
                ch_00->sex = sVar2;
                bVar1 = is_npc(ch_00);
                if (bVar1) {
                  return;
                }
                ch_00->pcdata->true_sex = sVar2;
                return;
              }
              pcVar5 = "Sex range is 0 to 2.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"class");
            if (!bVar1) {
              bVar1 = is_npc(ch_00);
              if (!bVar1) {
                iVar4 = CClass::Lookup(arg3);
                if (iVar4 != -1) {
                  pCVar6 = CClass::GetClass(iVar4);
                  ch_00->my_class = pCVar6;
                  return;
                }
                builtin_strncpy(buf,"Possible classes are: ",0x17);
                iVar4 = 0;
                do {
                  if (iVar4 != 0) {
                    if (iVar4 == 0xc) goto LAB_002ccf36;
                    sVar7 = strlen(buf);
                    (buf + sVar7)[0] = ' ';
                    (buf + sVar7)[1] = '\0';
                  }
                  pCVar6 = CClass::GetClass(iVar4);
                  pcVar5 = RString::operator_cast_to_char_(&pCVar6->name);
                  strcat(buf,pcVar5);
                  iVar4 = iVar4 + 1;
                } while( true );
              }
              pcVar5 = "Mobiles have no class.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"level");
            if (!bVar1) {
              bVar1 = is_npc(ch_00);
              if (bVar1) {
                if (uVar3 < 0x3d) {
                  ch_00->level = sVar2;
                  return;
                }
                pcVar5 = "Level range is 0 to 60.\n\r";
              }
              else {
                pcVar5 = "Not on PC\'s.\n\r";
              }
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"gold");
            if (!bVar1) {
              ch_00->gold = (long)(int)uVar3;
              return;
            }
            bVar1 = str_prefix(arg2,"hp");
            if (!bVar1) {
              if (0xffff8ac4 < uVar3 - 0x7531) {
                ch_00->max_hit = sVar2;
                bVar1 = is_npc(ch_00);
                if (bVar1) {
                  return;
                }
                ch_00->pcdata->perm_hit = sVar2;
                return;
              }
              pcVar5 = "Hp range is -10 to 30,000 hit points.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"mana");
            if (!bVar1) {
              if (uVar3 < 0x7531) {
                ch_00->max_mana = sVar2;
                bVar1 = is_npc(ch_00);
                if (bVar1) {
                  return;
                }
                ch_00->pcdata->perm_mana = sVar2;
                return;
              }
              pcVar5 = "mana range is 0 to 30,000 mana points.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"move");
            if (!bVar1) {
              if (uVar3 < 0x7531) {
                ch_00->max_move = sVar2;
                bVar1 = is_npc(ch_00);
                if (bVar1) {
                  return;
                }
                ch_00->pcdata->perm_move = sVar2;
                return;
              }
              pcVar5 = "Move range is 0 to 30,000 move points.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"practice");
            if (!bVar1) {
              if (uVar3 < 0xfb) {
                ch_00->practice = sVar2;
                return;
              }
              pcVar5 = "Practice range is 0 to 250 sessions.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"train");
            if (!bVar1) {
              if (uVar3 < 0x33) {
                ch_00->train = sVar2;
                return;
              }
              pcVar5 = "Training session range is 0 to 50 sessions.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"align");
            if (!bVar1) {
              if (0xfffff82e < uVar3 - 0x3e9) {
                ch_00->alignment = sVar2;
                return;
              }
              pcVar5 = "Alignment range is -1000 to 1000.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"ethos");
            if (!bVar1) {
              if (0xfffff82e < uVar3 - 0x3e9) {
                bVar1 = is_npc(ch_00);
                if (bVar1) {
                  return;
                }
                ch_00->pcdata->ethos = sVar2;
                return;
              }
              pcVar5 = "Ethos range is -1000 to 1000.\n\r";
              goto LAB_002ccbd8;
            }
            bVar1 = str_prefix(arg2,"thirst");
            if (bVar1) {
              bVar1 = str_prefix(arg2,"drunk");
              if (bVar1) {
                bVar1 = str_prefix(arg2,"hunger");
                if (bVar1) {
                  bVar1 = str_prefix(arg2,"race");
                  if (!bVar1) {
                    iVar4 = race_lookup(arg3);
                    if (iVar4 == 0) {
                      pcVar5 = "That is not a valid race.\n\r";
                    }
                    else {
                      bVar1 = is_npc(ch_00);
                      if ((bVar1) ||
                         (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                          _M_impl.super__Vector_impl_data._M_start[iVar4].pc_race != false)) {
                        ch_00->race = (short)iVar4;
                        ch_00->size = pc_race_table[iVar4].size;
                        return;
                      }
                      pcVar5 = "That is not a valid player race.\n\r";
                    }
                    goto LAB_002ccbd8;
                  }
                  bVar1 = str_prefix(arg2,"group");
                  if (!bVar1) {
                    bVar1 = is_npc(ch_00);
                    if (bVar1) {
                      ch_00->group = sVar2;
                      return;
                    }
                    pcVar5 = "Only on NPCs.\n\r";
                    goto LAB_002ccbd8;
                  }
                  bVar1 = str_prefix(arg2,"dam_mod");
                  if (!bVar1) {
                    bVar1 = is_number(arg3);
                    if (!bVar1) {
                      pcVar5 = "Invalid dam_mod.\n\r";
                      goto LAB_002ccbd8;
                    }
                    iVar4 = atoi(arg3);
                    ch_00->dam_mod = (float)iVar4;
                    bVar1 = is_npc(ch_00);
                    sprintf(buf,"%s\'s dam_mod set to %f%%.\n\r",SUB84((double)ch_00->dam_mod,0),
                            (&ch_00->name)[(ulong)bVar1 * 4]);
                    goto LAB_002cccd1;
                  }
                  bVar1 = str_prefix(arg2,"tribe");
                  if ((!bVar1) && (iVar4 = get_trust(ch), 0x3a < iVar4)) {
                    sVar2 = 0;
                    for (ptVar10 = tribe_table; ptVar10->name != (char *)0x0; ptVar10 = ptVar10 + 1)
                    {
                      bVar1 = str_prefix(arg3,ptVar10->name);
                      if (!bVar1) {
                        pcVar5 = ptVar10->name;
                        if (pcVar5 != (char *)0x0) {
                          ch_00->pcdata->tribe = sVar2;
                          pcVar9 = ch_00->name;
                          pcVar8 = capitalize(pcVar5);
                          pcVar5 = buf;
                          sprintf(pcVar5,"%s is now in the %s tribe.\n\r",pcVar9,pcVar8);
                          goto LAB_002ccbd8;
                        }
                        break;
                      }
                      sVar2 = sVar2 + 1;
                    }
                    pcVar5 = "There is no tribe by that name.\n\r";
                    goto LAB_002ccbd8;
                  }
                  bVar1 = str_prefix(arg2,"specializations");
                  if (bVar1) {
                    bVar1 = str_prefix(arg2,"pause");
                    if (bVar1) {
                      bVar1 = str_prefix(arg2,"proficiency");
                      if (!bVar1) {
                        pcVar9 = one_argument(pcVar5,buf);
                        sVar2 = CProficiencies::ProfIndexLookup(buf);
                        bVar1 = is_npc(ch_00);
                        if (bVar1) {
                          pcVar5 = "Not on mobiles.\n\r";
                        }
                        else {
                          pcVar5 = "Invalid input.\n\r";
                          if (((-1 < sVar2) && (bVar1 = is_number(pcVar9), bVar1)) &&
                             (iVar4 = atoi(pcVar9), 0xfffffff3 < iVar4 - 0xbU)) {
                            if (ch_00->pcdata == (PC_DATA *)0x0) {
                              pCVar11 = &prof_none;
                            }
                            else {
                              pCVar11 = &ch_00->pcdata->profs;
                            }
                            CProficiencies::SetProf(pCVar11,(int)sVar2,iVar4);
                            pcVar5 = "Proficiency set.\n\r";
                          }
                        }
                        goto LAB_002ccbd8;
                      }
                      bVar1 = str_prefix(arg2,"profpoints");
                      if (bVar1) {
                        do_mset(ch,"");
                        return;
                      }
                      bVar1 = is_npc(ch_00);
                      if ((!bVar1) && (bVar1 = is_number(arg3), bVar1)) {
                        pCVar11 = &ch_00->pcdata->profs;
                        if (ch_00->pcdata == (PC_DATA *)0x0) {
                          pCVar11 = &prof_none;
                        }
                        iVar4 = atoi(arg3);
                        CProficiencies::SetPoints(pCVar11,iVar4);
                        pcVar9 = ch_00->name;
                        pCVar11 = &ch_00->pcdata->profs;
                        if (ch_00->pcdata == (PC_DATA *)0x0) {
                          pCVar11 = &prof_none;
                        }
                        uVar3 = CProficiencies::GetPoints(pCVar11);
                        pcVar5 = buf;
                        sprintf(pcVar5,"%s now has %d proficiency points.\n\r",pcVar9,(ulong)uVar3);
                        goto LAB_002ccbd8;
                      }
                    }
                    else {
                      bVar1 = is_npc(ch_00);
                      if (!bVar1) {
                        bVar1 = is_number(arg3);
                        if (!bVar1) {
                          pcVar5 = "Invalid pause.\n\r";
                          goto LAB_002ccbd8;
                        }
                        iVar4 = atoi(arg3);
                        sVar2 = (short)iVar4;
                        ch_00->pause = sVar2;
                        pcVar5 = ch_00->true_name;
                        pcVar9 = "%s\'s pause set to %d.\n\r";
                        goto LAB_002cd43b;
                      }
                    }
                  }
                  else {
                    bVar1 = is_npc(ch_00);
                    if ((!bVar1) && (bVar1 = is_number(arg3), bVar1)) {
                      iVar4 = atoi(arg3);
                      sVar2 = (short)iVar4;
                      ch_00->pcdata->special = sVar2;
                      pcVar5 = ch_00->name;
                      pcVar9 = "%s now has %d specializations.\n\r";
LAB_002cd43b:
                      sprintf(buf,pcVar9,pcVar5,(ulong)(uint)(int)sVar2);
                      goto LAB_002cccd1;
                    }
                  }
                  pcVar5 = "You can\'t do that.\n\r";
                  goto LAB_002ccbd8;
                }
                bVar1 = is_npc(ch_00);
                if (!bVar1) {
                  if (0xffffff99 < uVar3 - 0x65) {
                    ch_00->pcdata->condition[3] = sVar2;
                    return;
                  }
                  pcVar5 = "Full range is -1 to 100.\n\r";
                  goto LAB_002ccbd8;
                }
              }
              else {
                bVar1 = is_npc(ch_00);
                if (!bVar1) {
                  if (0xffffff99 < uVar3 - 0x65) {
                    ch_00->pcdata->condition[0] = sVar2;
                    return;
                  }
                  pcVar5 = "Drunk range is -1 to 100.\n\r";
                  goto LAB_002ccbd8;
                }
              }
            }
            else {
              bVar1 = is_npc(ch_00);
              if (!bVar1) {
                if (0xffffff99 < uVar3 - 0x65) {
                  ch_00->pcdata->condition[2] = sVar2;
                  return;
                }
                pcVar5 = "Thirst range is -1 to 100.\n\r";
                goto LAB_002ccbd8;
              }
            }
LAB_002cccf9:
            pcVar5 = "Not on NPC\'s.\n\r";
            goto LAB_002ccbd8;
          }
          if ((2 < (int)uVar3) && (iVar4 = get_max_train(ch_00,4), (int)uVar3 <= iVar4)) {
            ch_00->perm_stat[4] = sVar2;
            return;
          }
          uVar3 = get_max_train(ch_00,4);
          pcVar5 = "Constitution range is 3 to %d.\n\r";
        }
        else {
          if ((2 < (int)uVar3) && (iVar4 = get_max_train(ch_00,3), (int)uVar3 <= iVar4)) {
            ch_00->perm_stat[3] = sVar2;
            return;
          }
          uVar3 = get_max_train(ch_00,3);
          pcVar5 = "Dexterity ranges is 3 to %d.\n\r";
        }
      }
      else {
        if ((2 < (int)uVar3) && (iVar4 = get_max_train(ch_00,2), (int)uVar3 <= iVar4)) {
          ch_00->perm_stat[2] = sVar2;
          return;
        }
        uVar3 = get_max_train(ch_00,2);
        pcVar5 = "Wisdom range is 3 to %d.\n\r";
      }
    }
    else {
      if ((2 < (int)uVar3) && (iVar4 = get_max_train(ch_00,1), (int)uVar3 <= iVar4)) {
        ch_00->perm_stat[1] = sVar2;
        return;
      }
      uVar3 = get_max_train(ch_00,1);
      pcVar5 = "Intelligence range is 3 to %d.\n\r";
    }
  }
  else {
    if ((2 < (int)uVar3) && (iVar4 = get_max_train(ch_00,0), (int)uVar3 <= iVar4)) {
      ch_00->perm_stat[0] = sVar2;
      return;
    }
    uVar3 = get_max_train(ch_00,0);
    pcVar5 = "Strength range is 3 to %d\n\r.";
  }
  sprintf(buf,pcVar5,(ulong)uVar3);
LAB_002cccd1:
  pcVar5 = buf;
LAB_002ccbd8:
  send_to_char(pcVar5,ch);
  return;
LAB_002ccf36:
  sVar7 = strlen(buf);
  builtin_strncpy(buf + sVar7,".\n\r",4);
  goto LAB_002cccd1;
}

Assistant:

void do_mset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char buf[300];
	CHAR_DATA *victim;
	int value, i;
	AFFECT_DATA af;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set char <name> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    str int wis dex con sex class level\n\r", ch);
		send_to_char("    race group gold hp mana move prac\n\r", ch);
		send_to_char("    align train thirst hunger drunk home\n\r", ch);
		send_to_char("    xptotal size dam_mod tribe special pause\n\r", ch);
		send_to_char("    beauty security aggressor proficiency profpoints\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	/* clear zones for mobs */
	victim->zone = nullptr;

	/*
	 * Snarf the value (which need not be numeric).
	 */
	value = is_number(arg3) ? atoi(arg3) : -1;

	/*
	 * Set something.
	 */
	if (!str_cmp(arg2, "aggressor"))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_aggressor;
		af.aftype = AFT_INVIS;
		af.level = 60;
		af.duration = 12;
		affect_to_char(victim, &af);

		send_to_char("Aggressor status set.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg2, "beauty"))
	{
		if (value > 0 && value < 11)
		{
			victim->pcdata->beauty = value;
			return;
		}
		else
		{
			send_to_char("Invalid beauty modifier.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "size"))
	{
		if (value > -1 && value <= SIZE_IMMENSE)
		{
			victim->size = value;
			return;
		}

		send_to_char("Invalid size value.\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "xptotal"))
	{
		if (value < 0)
		{
			send_to_char("Xp total must be greater than 0.\n\r", ch);
			return;
		}

		victim->exp = value;
		return;
	}

	if (!str_cmp(arg2, "home"))
	{
		if (hometown_lookup(arg3))
		{
			victim->hometown = hometown_lookup(arg3);
			return;
		}
		else
		{
			send_to_char("No such hometown.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "sp"))
	{
		if (value < 0 || value > 20000)
		{
			send_to_char("Specialization points are between 0 and 20000.\n\r", ch);
			return;
		}

		victim->pcdata->sp = value;
		return;
	}

	if (!str_cmp(arg2, "str"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_STR))
		{
			sprintf(buf, "Strength range is 3 to %d\n\r.", get_max_train(victim, STAT_STR));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_STR] = value;
		return;
	}

	if (!str_cmp(arg2, "security")) /* OLC */
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 10)
		{
			send_to_char("Valid security is 0-10 only.\n\r", ch);
		}
		else
		{
			victim->pcdata->security = value;
		}

		return;
	}

	if (!str_cmp(arg2, "int"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_INT))
		{
			sprintf(buf, "Intelligence range is 3 to %d.\n\r", get_max_train(victim, STAT_INT));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_INT] = value;
		return;
	}

	if (!str_cmp(arg2, "wis"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_WIS))
		{
			sprintf(buf, "Wisdom range is 3 to %d.\n\r", get_max_train(victim, STAT_WIS));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_WIS] = value;
		return;
	}

	if (!str_cmp(arg2, "dex"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_DEX))
		{
			sprintf(buf, "Dexterity ranges is 3 to %d.\n\r", get_max_train(victim, STAT_DEX));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_DEX] = value;
		return;
	}

	if (!str_cmp(arg2, "con"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_CON))
		{
			sprintf(buf, "Constitution range is 3 to %d.\n\r", get_max_train(victim, STAT_CON));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_CON] = value;
		return;
	}

	if (!str_prefix(arg2, "sex"))
	{
		if (value < 0 || value > 2)
		{
			send_to_char("Sex range is 0 to 2.\n\r", ch);
			return;
		}

		victim->sex = value;

		if (!is_npc(victim))
			victim->pcdata->true_sex = value;

		return;
	}

	if (!str_prefix(arg2, "class"))
	{
		if (is_npc(victim))
		{
			send_to_char("Mobiles have no class.\n\r", ch);
			return;
		}

		int sclass = CClass::Lookup(arg3);
		if (sclass == -1)
		{
			char buf[MAX_STRING_LENGTH];

			strcpy(buf, "Possible classes are: ");
			for (sclass = 0; sclass < MAX_CLASS; sclass++)
			{
				if (sclass > 0)
					strcat(buf, " ");

				strcat(buf, CClass::GetClass(sclass)->name);
			}

			strcat(buf, ".\n\r");

			send_to_char(buf, ch);
			return;
		}

		victim->SetClass(sclass);
		return;
	}

	if (!str_prefix(arg2, "level"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Not on PC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 60)
		{
			send_to_char("Level range is 0 to 60.\n\r", ch);
			return;
		}

		victim->level = value;
		return;
	}

	if (!str_prefix(arg2, "gold"))
	{
		victim->gold = value;
		return;
	}

	if (!str_prefix(arg2, "hp"))
	{
		if (value < -10 || value > 30000)
		{
			send_to_char("Hp range is -10 to 30,000 hit points.\n\r", ch);
			return;
		}

		victim->max_hit = value;

		if (!is_npc(victim))
			victim->pcdata->perm_hit = value;

		return;
	}

	if (!str_prefix(arg2, "mana"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("mana range is 0 to 30,000 mana points.\n\r", ch);
			return;
		}

		victim->max_mana = value;

		if (!is_npc(victim))
			victim->pcdata->perm_mana = value;

		return;
	}

	if (!str_prefix(arg2, "move"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("Move range is 0 to 30,000 move points.\n\r", ch);
			return;
		}

		victim->max_move = value;

		if (!is_npc(victim))
			victim->pcdata->perm_move = value;

		return;
	}

	if (!str_prefix(arg2, "practice"))
	{
		if (value < 0 || value > 250)
		{
			send_to_char("Practice range is 0 to 250 sessions.\n\r", ch);
			return;
		}

		victim->practice = value;
		return;
	}

	if (!str_prefix(arg2, "train"))
	{
		if (value < 0 || value > 50)
		{
			send_to_char("Training session range is 0 to 50 sessions.\n\r", ch);
			return;
		}

		victim->train = value;
		return;
	}

	if (!str_prefix(arg2, "align"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Alignment range is -1000 to 1000.\n\r", ch);
			return;
		}

		victim->alignment = value;
		return;
	}

	if (!str_prefix(arg2, "ethos"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Ethos range is -1000 to 1000.\n\r", ch);
			return;
		}

		if (!is_npc(victim))
			victim->pcdata->ethos = value;

		return;
	}

	if (!str_prefix(arg2, "thirst"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Thirst range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_THIRST] = value;
		return;
	}

	if (!str_prefix(arg2, "drunk"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Drunk range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_DRUNK] = value;
		return;
	}

	if (!str_prefix(arg2, "hunger"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Full range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_HUNGER] = value;
		return;
	}

	if (!str_prefix(arg2, "race"))
	{
		int race = race_lookup(arg3);

		if (race == 0)
		{
			send_to_char("That is not a valid race.\n\r", ch);
			return;
		}

		if (!is_npc(victim) && !race_table[race].pc_race)
		{
			send_to_char("That is not a valid player race.\n\r", ch);
			return;
		}

		victim->race = race;
		victim->size = pc_race_table[race].size;
		return;
	}

	if (!str_prefix(arg2, "group"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Only on NPCs.\n\r", ch);
			return;
		}

		victim->group = value;
		return;
	}

	if (!str_prefix(arg2, "dam_mod"))
	{
		if (!is_number(arg3))
		{
			send_to_char("Invalid dam_mod.\n\r", ch);
			return;
		}

		victim->dam_mod = atoi(arg3);

		sprintf(buf, "%s's dam_mod set to %f%%.\n\r",
			is_npc(victim) ? victim->short_descr : victim->name,
			victim->dam_mod);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "tribe") && get_trust(ch) >= 59)
	{
		for (i = 0; tribe_table[i].name; i++)
		{
			if (!str_prefix(arg3, tribe_table[i].name))
				break;
		}

		if (!tribe_table[i].name)
		{
			send_to_char("There is no tribe by that name.\n\r", ch);
			return;
		}

		victim->pcdata->tribe = i;

		sprintf(buf, "%s is now in the %s tribe.\n\r", victim->name, capitalize(tribe_table[i].name));
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "specializations"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->pcdata->special = atoi(arg3);

		sprintf(buf, "%s now has %d specializations.\n\r", victim->name, victim->pcdata->special);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "pause"))
	{
		if (is_npc(victim))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		if (!is_number(arg3))
		{
			send_to_char("Invalid pause.\n\r", ch);
			return;
		}

		victim->pause = atoi(arg3);

		sprintf(buf, "%s's pause set to %d.\n\r", victim->true_name, victim->pause);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "proficiency"))
	{
		char buf4[MSL];

		argument = one_argument(argument, buf4);

		int ind = CProficiencies::ProfIndexLookup(buf4);

		if (is_npc(victim))
		{
			send_to_char("Not on mobiles.\n\r", ch);
			return;
		}

		if (ind < 0 || !is_number(argument) || atoi(argument) > 10 || atoi(argument) < -1)
		{
			send_to_char("Invalid input.\n\r", ch);
			return;
		}

		victim->Profs()->SetProf(ind, atoi(argument));

		send_to_char("Proficiency set.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "profpoints"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->Profs()->SetPoints(atoi(arg3));

		sprintf(buf, "%s now has %d proficiency points.\n\r", victim->name, victim->Profs()->GetPoints());
		send_to_char(buf, ch);
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_mset(ch, "");
}